

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *lib,string *libRef,cmTargetLinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  size_t __n_00;
  long lVar4;
  cmMakefile *this_00;
  int iVar5;
  PolicyStatus PVar6;
  cmTarget *pcVar7;
  long *plVar8;
  size_type sVar9;
  char *pcVar10;
  ulong *puVar11;
  byte bVar12;
  string libName;
  string targetEntry;
  cmTargetLinkLibraryType local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmMakefile *local_58;
  string local_50;
  
  bVar12 = 0;
  local_9c = llt;
  local_58 = mf;
  pcVar7 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (pcVar7 != (cmTarget *)0x0) {
    bVar12 = ((pcVar7->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ^ 1;
  }
  if ((bVar12 == 0) || (local_9c == GENERAL_LibraryType)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar2 = (libRef->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + libRef->_M_string_length);
  }
  else {
    std::operator+(&local_78,"$<TARGET_NAME:",libRef);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_98.field_2._M_allocated_capacity = *puVar11;
      local_98.field_2._8_8_ = plVar8[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar11;
      local_98._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_98._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"LINK_LIBRARIES","");
  GetDebugGeneratorExpressions(&local_50,this,&local_98,local_9c);
  AppendProperty(this,&local_78,local_50._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  sVar9 = cmGeneratorExpression::Find(lib);
  if ((sVar9 == 0xffffffffffffffff) &&
     (__n = lib->_M_string_length, __n == libRef->_M_string_length)) {
    if ((__n != 0) &&
       (iVar5 = bcmp((lib->_M_dataplus)._M_p,(libRef->_M_dataplus)._M_p,__n), iVar5 != 0)) {
      return;
    }
    if ((pcVar7 == (cmTarget *)0x0) ||
       ((iVar5 = ((pcVar7->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType,
        iVar5 != 4 && (iVar5 != 7)))) {
      _Var3._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      __n_00 = *(size_type *)((long)&(_Var3._M_head_impl)->Name + 8);
      if (__n_00 == __n) {
        if (__n_00 == 0) {
          return;
        }
        iVar5 = bcmp(((_Var3._M_head_impl)->Name)._M_dataplus._M_p,(lib->_M_dataplus)._M_p,__n_00);
        if (iVar5 == 0) {
          return;
        }
      }
      std::
      vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
      ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                  *)&(_Var3._M_head_impl)->OriginalLinkLibraries,lib,&local_9c);
      _Var3._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if ((_Var3._M_head_impl)->TargetType - 1 < 3) {
        PVar6 = cmPolicies::PolicyMap::Get(&(_Var3._M_head_impl)->PolicyMap,CMP0073);
        if ((PVar6 != OLD) &&
           (PVar6 = cmPolicies::PolicyMap::Get
                              (&((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                PolicyMap,CMP0073), PVar6 != WARN)) {
          return;
        }
        _Var3._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        lVar4 = *(long *)&((_Var3._M_head_impl)->Name)._M_dataplus;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,lVar4,
                   *(size_type *)((long)&(_Var3._M_head_impl)->Name + 8) + lVar4);
        std::__cxx11::string::append((char *)&local_78);
        this_00 = local_58;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity =
             local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_98._M_dataplus._M_p = (pointer)paVar1;
        pcVar10 = cmMakefile::GetDefinition(local_58,&local_78);
        if (pcVar10 != (char *)0x0) {
          std::__cxx11::string::append((char *)&local_98);
        }
        if (local_9c < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
          std::__cxx11::string::append((char *)&local_98);
        }
        std::__cxx11::string::append((char *)&local_98);
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)(lib->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_98);
        cmMakefile::AddCacheDefinition
                  (this_00,&local_78,local_98._M_dataplus._M_p,"Dependencies for the target",STATIC,
                   false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              std::string const& libRef,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(libRef)
      : libRef;
    this->AppendProperty(
      "LINK_LIBRARIES",
      this->GetDebugGeneratorExpressions(libName, llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos || lib != libRef ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (impl->Name == lib)) {
    return;
  }

  impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = impl->Name;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies.c_str(),
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}